

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_text_read::TextReader::read_string(TextReader *this,string *result)

{
  bool bVar1;
  char *pcVar2;
  string *out;
  string_view data;
  bool local_51;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string_view local_38;
  char *local_28;
  char *quote_end;
  string *result_local;
  TextReader *this_local;
  
  quote_end = (char *)result;
  result_local = (string *)this;
  while( true ) {
    bVar1 = is_eof(this);
    local_51 = false;
    if (!bVar1) {
      local_51 = one_of<(char)32,(char)9,(char)13>(*this->cur_);
    }
    if (local_51 == false) break;
    this->cur_ = this->cur_ + 1;
  }
  if (this->cur_ == this->cap_) {
    this_local._7_1_ = false;
  }
  else if ((*this->cur_ == '\"') || (*this->cur_ == '\'')) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,this->cur_,(long)this->cap_ - (long)this->cur_);
    local_28 = str_unquote_fetch_end(local_38);
    if (local_28 == this->cap_) {
      this_local._7_1_ = false;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)quote_end);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)quote_end,
                 (long)local_28 - (long)this->cur_);
      out = (string *)(this->cur_ + 1);
      this->cur_ = (char *)out;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,this->cur_,(long)local_28 - (long)this->cur_);
      data._M_str = quote_end;
      data._M_len = (size_t)local_48._M_str;
      pcVar2 = str_unquote((ritobin *)local_48._M_len,data,out);
      this->cur_ = pcVar2;
      if (this->cur_ == local_28) {
        this->cur_ = this->cur_ + 1;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool read_string(std::string& result) noexcept {
            // FIXME: unicode verification
            while (!is_eof() && one_of<' ', '\t', '\r'>(*cur_)) {
                cur_++;
            }
            if (cur_ == cap_) {
                return false;
            }
            if (*cur_ != '"' && *cur_ != '\'') {
                return false;
            }
            auto quote_end = str_unquote_fetch_end(std::string_view{cur_, (size_t)(cap_ - cur_)});
            if (quote_end == cap_) {
                return false;
            }
            result.clear();
            result.reserve(quote_end - cur_);
            ++cur_;
            cur_ = str_unquote(std::string_view{cur_, (size_t)(quote_end - cur_)}, result);
            if (cur_ != quote_end) {
                return false;
            }
            cur_++;
            return true;
        }